

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

void __thiscall choc::value::Value::Value(Value *this,Value *other)

{
  Content *pCVar1;
  MainType MVar2;
  pointer puVar3;
  ComplexArray *other_00;
  Object *other_01;
  undefined8 uVar4;
  Object *this_00;
  Content *pCVar5;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->packedData,&other->packedData);
  (this->dictionary).super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__SimpleStringDictionary_002cab48;
  std::vector<char,_std::allocator<char>_>::vector
            (&(this->dictionary).strings,&(other->dictionary).strings);
  puVar3 = (this->packedData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  MVar2 = (other->value).type.mainType;
  pCVar1 = &(this->value).type.content;
  pCVar5 = &(other->value).type.content;
  (this->value).type.mainType = MVar2;
  (this->value).type.content.object = (Object *)0x0;
  (this->value).type.allocator = (Allocator *)0x0;
  if (MVar2 == object) {
    other_01 = pCVar5->object;
    this_00 = (Object *)malloc(0x28);
    Type::Object::Object(this_00,(Allocator *)0x0,other_01);
  }
  else {
    if (MVar2 != complexArray) {
      uVar4 = *(undefined8 *)((long)&(other->value).type.content + 8);
      pCVar1->object = pCVar5->object;
      *(undefined8 *)((long)&(this->value).type.content + 8) = uVar4;
      goto LAB_001be063;
    }
    other_00 = pCVar5->complexArray;
    this_00 = (Object *)malloc(0x18);
    Type::ComplexArray::ComplexArray((ComplexArray *)this_00,(Allocator *)0x0,other_00);
  }
  pCVar1->complexArray = (ComplexArray *)this_00;
LAB_001be063:
  (this->value).data = puVar3;
  (this->value).stringDictionary = &(this->dictionary).super_StringDictionary;
  return;
}

Assistant:

inline Value::Value (const Value& other)
   : packedData (other.packedData), dictionary (other.dictionary),
     value (other.value.type, packedData.data(), std::addressof (dictionary))
{
}